

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall lodepng::ExtractPNG::decode(ExtractPNG *this,uchar *in,size_t size)

{
  uchar *buffer;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> idat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  ExtractZlib zlib;
  
  this->error = 0;
  if (in == (uchar *)0x0 || size == 0) {
    this->error = 0x30;
  }
  else {
    readPngHeader(this,in,size);
    if (this->error == 0) {
      idat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      idat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      idat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar6 = 0x21;
      bVar2 = false;
      while (!bVar2) {
        uVar5 = lVar6 + 8;
        if (size <= uVar5) {
          this->error = 0x1e;
          goto LAB_0011c2b2;
        }
        buffer = in + lVar6;
        uVar4 = read32bitInt(this,buffer);
        if ((uVar4 & 0xffffffff80000000) != 0) {
          this->error = 0x3f;
          goto LAB_0011c2b2;
        }
        uVar1 = uVar4 + lVar6 + 4;
        if (size <= uVar1) {
          this->error = 0x23;
          goto LAB_0011c2b2;
        }
        if (in[lVar6 + 4] == 'I') {
          if (buffer[5] == 'E') {
            if ((buffer[6] != 'N') || (bVar2 = true, buffer[7] != 'D')) goto LAB_0011c227;
          }
          else {
            if ((buffer[5] != 'D') || ((buffer[6] != 'A' || (buffer[7] != 'T')))) goto LAB_0011c227;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<unsigned_char_const*,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&idat,
                       (const_iterator)
                       idat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,in + uVar5,in + uVar5 + uVar4);
            uVar5 = uVar1 + 4;
            bVar2 = false;
          }
        }
        else {
LAB_0011c227:
          uVar5 = uVar1 + 4;
          bVar2 = false;
        }
        lVar6 = uVar5 + 4;
      }
      out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      zlib.zlibinfo = this->zlibinfo;
      zlib.codetree.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      zlib.codetree.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      zlib.codetree.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      zlib.codetreeD.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      zlib.codetreeD.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      zlib.codetreeD.tree2d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      zlib.codelengthcodetree.tree2d.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      zlib.codelengthcodetree.tree2d.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      zlib.codelengthcodetree.tree2d.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar3 = ExtractZlib::decompress(&zlib,&out,&idat);
      this->error = iVar3;
      ExtractZlib::~ExtractZlib(&zlib);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0011c2b2:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&idat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  return;
}

Assistant:

void decode(const unsigned char* in, size_t size) {
    error = 0;
    if(size == 0 || in == 0) { error = 48; return; } //the given data is empty
    readPngHeader(&in[0], size); if(error) return;
    size_t pos = 33; //first byte of the first chunk after the header
    std::vector<unsigned char> idat; //the data from idat chunks
    bool IEND = false;
    //loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
    //IDAT data is put at the start of the in buffer
    while(!IEND) {
      //error: size of the in buffer too small to contain next chunk
      if(pos + 8 >= size) { error = 30; return; }
      size_t chunkLength = read32bitInt(&in[pos]); pos += 4;
      if(chunkLength > 2147483647) { error = 63; return; }
      //error: size of the in buffer too small to contain next chunk
      if(pos + chunkLength >= size) { error = 35; return; }
      //IDAT chunk, containing compressed image data
      if(in[pos + 0] == 'I' && in[pos + 1] == 'D' && in[pos + 2] == 'A' && in[pos + 3] == 'T') {
        idat.insert(idat.end(), &in[pos + 4], &in[pos + 4 + chunkLength]);
        pos += (4 + chunkLength);
      } else if(in[pos + 0] == 'I' && in[pos + 1] == 'E' && in[pos + 2] == 'N' && in[pos + 3] == 'D') {
          pos += 4;
          IEND = true;
      } else { //it's not an implemented chunk type, so ignore it: skip over the data
        pos += (chunkLength + 4); //skip 4 letters and uninterpreted data of unimplemented chunk
      }
      pos += 4; //step over CRC (which is ignored)
    }
    std::vector<unsigned char> out; //now the out buffer will be filled
    ExtractZlib zlib(zlibinfo); //decompress with the Zlib decompressor
    error = zlib.decompress(out, idat);
    if(error) return; //stop if the zlib decompressor returned an error
  }